

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qocspresponse.cpp
# Opt level: O2

size_t qHash(QOcspResponse *response,size_t seed)

{
  QOcspResponsePrivate *pQVar1;
  bool bVar2;
  result_type rVar3;
  long in_FS_OFFSET;
  QHashCombine hasher;
  QOcspCertificateStatus local_28;
  QHashCombine local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (response->d).d.ptr;
  local_21 = (QHashCombine)0xaa;
  local_28 = pQVar1->certificateStatus;
  rVar3 = QtPrivate::QHashCombine::operator()(&local_21,seed,(int *)&local_28);
  local_28 = pQVar1->revocationReason;
  rVar3 = QtPrivate::QHashCombine::operator()(&local_21,rVar3,(int *)&local_28);
  bVar2 = QSslCertificate::isNull(&pQVar1->signerCert);
  if (!bVar2) {
    rVar3 = QtPrivate::QHashCombine::operator()(&local_21,rVar3,&pQVar1->signerCert);
  }
  bVar2 = QSslCertificate::isNull(&pQVar1->subjectCert);
  if (!bVar2) {
    rVar3 = QtPrivate::QHashCombine::operator()(&local_21,rVar3,&pQVar1->subjectCert);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return rVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QOcspResponse &response, size_t seed) noexcept
{
    const QOcspResponsePrivate *d = response.d.data();
    Q_ASSERT(d);

    QtPrivate::QHashCombine hasher;
    size_t hash = hasher(seed, int(d->certificateStatus));
    hash = hasher(hash, int(d->revocationReason));
    if (!d->signerCert.isNull())
        hash = hasher(hash, d->signerCert);
    if (!d->subjectCert.isNull())
        hash = hasher(hash, d->subjectCert);

    return hash;
}